

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapStoreOptimization.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_166::HeapStoreOptimization::visitFunction
          (HeapStoreOptimization *this,Function *curr)

{
  Id IVar1;
  pointer puVar2;
  BasicBlock *pBVar3;
  pointer pppEVar4;
  Expression **ppEVar5;
  StructSet *set;
  LocalSet *pLVar6;
  StructNew *new_;
  StructSet *set_00;
  Expression *pEVar7;
  undefined8 uVar8;
  bool bVar9;
  pointer puVar10;
  ulong uVar11;
  pointer pppEVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  EffectAnalyzer local_358;
  undefined1 local_1f8 [8];
  EffectAnalyzer firstEffects;
  
  puVar10 = (this->
            super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
            ).
            super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
            .basicBlocks.
            super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->
           super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
           ).
           super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
           .basicBlocks.
           super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != puVar2) {
    firstEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&firstEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      pBVar3 = (puVar10->_M_t).
               super___uniq_ptr_impl<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
               .
               super__Head_base<0UL,_wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_false>
               ._M_head_impl;
      pppEVar4 = *(pointer *)((long)&(pBVar3->contents).actions + 8);
      for (pppEVar12 = *(pointer *)&(pBVar3->contents).actions; pppEVar12 != pppEVar4;
          pppEVar12 = pppEVar12 + 1) {
        ppEVar5 = *pppEVar12;
        set = (StructSet *)*ppEVar5;
        IVar1 = (set->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression._id;
        if (IVar1 == BlockId) {
          uVar11 = *(ulong *)&set->order;
          if (uVar11 != 0) {
            uVar15 = 0;
            do {
              pLVar6 = *(LocalSet **)(&set->value->_id + uVar15 * 8);
              iVar14 = (int)uVar15;
              if ((((pLVar6->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id
                    == LocalSetId) &&
                  (new_ = (StructNew *)pLVar6->value,
                  (new_->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression._id ==
                  StructNewId)) && (uVar13 = (ulong)(iVar14 + 1), uVar13 < uVar11)) {
                do {
                  set_00 = *(StructSet **)(&set->value->_id + uVar13 * 8);
                  IVar1 = (set_00->super_SpecificExpression<(wasm::Expression::Id)67>).
                          super_Expression._id;
                  if (((IVar1 == StructSetId) && (set_00->ref->_id == LocalGetId)) &&
                     (*(Index *)(set_00->ref + 1) == pLVar6->index)) {
                    bVar9 = optimizeSubsequentStructSet(this,new_,set_00,pLVar6);
                    if (!bVar9) break;
                    (set_00->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression.
                    _id = NopId;
                    (set_00->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression.
                    type.id = 0;
                  }
                  else {
                    if ((uVar11 - 1 == uVar13) ||
                       ((IVar1 == LocalSetId && (set_00->ref->_id == StructNewId)))) break;
                    if ((uVar11 <= uVar15) ||
                       (EffectAnalyzer::EffectAnalyzer
                                  ((EffectAnalyzer *)local_1f8,
                                   &((this->
                                     super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                                     ).super_Pass.runner)->options,
                                   (this->
                                   super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                                   ).
                                   super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                                   .
                                   super_PostWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                                   .
                                   super_Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                                   .currModule,*(Expression **)(&set->value->_id + uVar15 * 8)),
                       *(ulong *)&set->order <= uVar13)) {
LAB_008cb3ae:
                      __assert_fail("index < usedElements",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                                    ,0xbc,
                                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                                   );
                    }
                    EffectAnalyzer::EffectAnalyzer
                              (&local_358,
                               &((this->
                                 super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                                 ).super_Pass.runner)->options,
                               (this->
                               super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                               ).
                               super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                               .
                               super_PostWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                               .
                               super_Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                               .currModule,*(Expression **)(&set->value->_id + uVar13 * 8));
                    bVar9 = EffectAnalyzer::invalidates(&local_358,(EffectAnalyzer *)local_1f8);
                    if (!bVar9) {
                      if ((*(ulong *)&set->order <= uVar15) || (*(ulong *)&set->order <= uVar13))
                      goto LAB_008cb3ae;
                      pEVar7 = set->value;
                      uVar8 = *(undefined8 *)(&pEVar7->_id + uVar15 * 8);
                      *(undefined8 *)(&pEVar7->_id + uVar15 * 8) =
                           *(undefined8 *)(&pEVar7->_id + uVar13 * 8);
                      *(undefined8 *)(&pEVar7->_id + uVar13 * 8) = uVar8;
                    }
                    std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::~_Rb_tree(&local_358.delegateTargets._M_t);
                    std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::~_Rb_tree(&local_358.breakTargets._M_t);
                    std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::~_Rb_tree(&local_358.globalsWritten._M_t);
                    std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::~_Rb_tree(&local_358.mutableGlobalsRead._M_t);
                    std::
                    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::~_Rb_tree(&local_358.localsWritten._M_t);
                    std::
                    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::~_Rb_tree(&local_358.localsRead._M_t);
                    std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                 *)firstEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
                    std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                 *)&firstEffects.danglingPop);
                    std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                 *)&firstEffects.mutableGlobalsRead._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count);
                    std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                 *)&firstEffects.localsWritten._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count);
                    std::
                    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)&firstEffects.localsRead._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count);
                    std::
                    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)&firstEffects.features);
                    uVar15 = uVar13;
                    if (bVar9) break;
                  }
                  uVar13 = (ulong)((int)uVar13 + 1);
                  uVar11 = *(ulong *)&set->order;
                } while (uVar13 < uVar11);
                uVar11 = *(ulong *)&set->order;
              }
              uVar15 = (ulong)(iVar14 + 1);
            } while (uVar15 < uVar11);
          }
        }
        else {
          if (IVar1 != StructSetId) {
            handle_unreachable("bad action",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/HeapStoreOptimization.cpp"
                               ,0x4c);
          }
          pLVar6 = (LocalSet *)set->ref;
          if ((((pLVar6->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id ==
                LocalSetId) &&
              ((((StructNew *)pLVar6->value)->super_SpecificExpression<(wasm::Expression::Id)65>).
               super_Expression._id == StructNewId)) &&
             (bVar9 = optimizeSubsequentStructSet(this,(StructNew *)pLVar6->value,set,pLVar6), bVar9
             )) {
            LocalSet::makeSet(pLVar6);
            *ppEVar5 = (Expression *)pLVar6;
          }
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar2);
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    // Now that the walk is complete and we have a CFG, find things to optimize.
    for (auto& block : basicBlocks) {
      for (auto** currp : block->contents.actions) {
        auto* curr = *currp;
        if (auto* set = curr->dynCast<StructSet>()) {
          optimizeStructSet(set, currp);
        } else if (auto* block = curr->dynCast<Block>()) {
          optimizeBlock(block);
        } else {
          WASM_UNREACHABLE("bad action");
        }
      }
    }
  }